

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * operator+=(QString *a,QStringBuilder<const_QString_&,_char16_t> *b)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  long lVar3;
  long lVar4;
  char16_t *pcVar5;
  char16_t *__dest;
  
  pDVar2 = (a->d).d;
  lVar3 = (a->d).size;
  lVar4 = (b->a->d).size;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData(a,lVar3,KeepSize);
  }
  lVar3 = lVar3 + lVar4 + 1;
  pDVar2 = (a->d).d;
  if (pDVar2 == (Data *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = (pDVar2->super_QArrayData).alloc -
            (((long)((long)(a->d).ptr -
                    ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
             1) + (a->d).size);
  }
  if (lVar4 < lVar3) {
    if (pDVar2 == (Data *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = (pDVar2->super_QArrayData).alloc * 2;
    }
    if (lVar4 < lVar3) {
      lVar4 = lVar3;
    }
    if (((pDVar2 == (Data *)0x0) ||
        (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((pDVar2->super_QArrayData).alloc -
        ((long)((long)(a->d).ptr -
               ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1)
        <= lVar4)) {
      lVar3 = (a->d).size;
      if (lVar4 < lVar3) {
        lVar4 = lVar3;
      }
      QString::reallocData(a,lVar4,KeepSize);
    }
    pDVar2 = (a->d).d;
    if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  pDVar2 = (a->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData(a,(a->d).size,KeepSize);
  }
  __dest = (a->d).ptr + (a->d).size;
  lVar3 = (b->a->d).size;
  if (lVar3 != 0) {
    pcVar5 = (b->a->d).ptr;
    if (pcVar5 == (char16_t *)0x0) {
      pcVar5 = L"";
    }
    memcpy(__dest,pcVar5,lVar3 * 2);
  }
  __dest[lVar3] = b->b;
  pcVar5 = (a->d).ptr;
  if (pcVar5 == (char16_t *)0x0) {
    pcVar5 = L"";
  }
  QString::resize(a,(long)(__dest + lVar3) + (2 - (long)pcVar5) >> 1);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}